

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O2

Position __thiscall
absl::cord_internal::CordRepBtreeNavigator::Seek(CordRepBtreeNavigator *this,size_t offset)

{
  CordRep *pCVar1;
  CordRepBtree *this_00;
  long lVar2;
  size_t offset_00;
  Position PVar3;
  Position PVar4;
  
  lVar2 = (long)this->height_;
  if ((-1 < lVar2) && (this_00 = this->node_[lVar2], this_00 != (CordRepBtree *)0x0)) {
    if (offset < (this_00->super_CordRep).length) {
      PVar3 = CordRepBtree::IndexOf(this_00,offset);
      while( true ) {
        offset_00 = PVar3.n;
        this->index_[lVar2] = (uint8_t)PVar3.index;
        if (lVar2 < 1) break;
        pCVar1 = CordRepBtree::Edge(this_00,PVar3.index);
        this_00 = CordRep::btree(pCVar1);
        this->node_[lVar2 + -1] = this_00;
        PVar3 = CordRepBtree::IndexOf(this_00,offset_00);
        lVar2 = lVar2 + -1;
      }
      pCVar1 = CordRepBtree::Edge(this_00,PVar3.index);
    }
    else {
      pCVar1 = (CordRep *)0x0;
      offset_00 = 0;
    }
    PVar4.offset = offset_00;
    PVar4.edge = pCVar1;
    return PVar4;
  }
  __assert_fail("btree() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree_navigator.h"
                ,0xc0,
                "CordRepBtreeNavigator::Position absl::cord_internal::CordRepBtreeNavigator::Seek(size_t)"
               );
}

Assistant:

inline CordRepBtree* CordRepBtreeNavigator::btree() const {
  return height_ >= 0 ? node_[height_] : nullptr;
}